

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_switch.cpp
# Opt level: O0

void __thiscall
DActiveButton::DActiveButton
          (DActiveButton *this,side_t *side,int Where,FSwitchDef *Switch,DVector2 *pos,bool useagain
          )

{
  bool useagain_local;
  DVector2 *pos_local;
  FSwitchDef *Switch_local;
  int Where_local;
  side_t *side_local;
  DActiveButton *this_local;
  
  DThinker::DThinker(&this->super_DThinker,100);
  (this->super_DThinker).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_009fb5a8;
  TVector2<double>::TVector2(&this->m_Pos);
  this->m_Side = side;
  Switch_local._4_1_ = (SBYTE)Where;
  this->m_Part = Switch_local._4_1_;
  TVector2<double>::operator=(&this->m_Pos,pos);
  this->bFlippable = useagain;
  this->bReturning = false;
  this->m_SwitchDef = Switch;
  this->m_Frame = -1;
  AdvanceFrame(this);
  return;
}

Assistant:

DActiveButton::DActiveButton (side_t *side, int Where, FSwitchDef *Switch,
							  const DVector2 &pos, bool useagain)
{
	m_Side = side;
	m_Part = SBYTE(Where);
	m_Pos = pos;
	bFlippable = useagain;
	bReturning = false;

	m_SwitchDef = Switch;
	m_Frame = -1;
	AdvanceFrame ();
}